

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astWhileContinueNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  anon_struct_40_5_caec50dc gcFrame;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.whileContinue = 0;
  gcFrame.whileMergeLabel = 0;
  gcFrame.whileEntryLabel = 0;
  gcFrame.whileBodyLabel = 0;
  gcFrame.result = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 5;
  local_20 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_38);
  gcFrame.whileEntryLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  gcFrame.whileBodyLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  gcFrame.whileContinue = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  gcFrame.whileMergeLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),gcFrame.whileEntryLabel);
  if (*(sysbvm_tuple_t *)(*arguments + 0x28) == 0) {
    sysbvm_functionBytecodeAssembler_jump
              (context,((sysbvm_functionBytecodeDirectCompiler_t *)arguments[1])->assembler,
               gcFrame.whileBodyLabel);
  }
  else {
    sVar1 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                      (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                       *(sysbvm_tuple_t *)(*arguments + 0x28));
    sysbvm_functionBytecodeAssembler_jumpIfFalse
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sVar1,
               gcFrame.whileMergeLabel);
  }
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),gcFrame.whileBodyLabel);
  if (*(sysbvm_tuple_t *)(*arguments + 0x30) != 0) {
    sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithBreakAndContinue
              (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
               *(sysbvm_tuple_t *)(*arguments + 0x30),gcFrame.whileMergeLabel,gcFrame.whileContinue)
    ;
  }
  sysbvm_functionBytecodeAssembler_jump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
             gcFrame.whileContinue);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),gcFrame.whileContinue);
  if (*(sysbvm_tuple_t *)(*arguments + 0x38) != 0) {
    sysbvm_functionBytecodeDirectCompiler_compileASTNode
              (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
               *(sysbvm_tuple_t *)(*arguments + 0x38));
  }
  sysbvm_functionBytecodeAssembler_jump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
             gcFrame.whileEntryLabel);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),gcFrame.whileMergeLabel);
  sysbvm_stackFrame_popRecord(&local_38);
  sVar1 = sysbvm_functionBytecodeAssembler_addLiteral
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),0x2f);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astWhileContinueNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astWhileContinueWithNode_t **whileNode = (sysbvm_astWhileContinueWithNode_t**)node;
    struct {
        sysbvm_tuple_t whileEntryLabel;
        sysbvm_tuple_t whileBodyLabel;
        sysbvm_tuple_t whileContinue;
        sysbvm_tuple_t whileMergeLabel;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.whileEntryLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.whileBodyLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.whileContinue = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.whileMergeLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);

    // While condition block.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.whileEntryLabel);
    if((*whileNode)->conditionExpression)
    {
        sysbvm_tuple_t condition = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*whileNode)->conditionExpression);
        sysbvm_functionBytecodeAssembler_jumpIfFalse(context, (*compiler)->assembler, condition, gcFrame.whileMergeLabel);
    }
    else
    {
        sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.whileBodyLabel);
    }

    // While body.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.whileBodyLabel);
    if((*whileNode)->bodyExpression)
        sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithBreakAndContinue(context, *compiler, (*whileNode)->bodyExpression, gcFrame.whileMergeLabel, gcFrame.whileContinue);
    sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.whileContinue);

    // While continue
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.whileContinue);
    if((*whileNode)->continueExpression)
        sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*whileNode)->continueExpression);

    sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.whileEntryLabel);

    // While merge
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.whileMergeLabel);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
}